

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHppGenerator.cpp
# Opt level: O2

iterator __thiscall
VideoHppGenerator::addImplicitlyRequiredTypes
          (VideoHppGenerator *this,iterator typeIt,ExtensionData *extensionData,iterator reqIt)

{
  _Base_ptr p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  uint __line;
  __type_conflict _Var3;
  bool bVar4;
  iterator iVar5;
  iterator typeIt_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  iterator iVar7;
  _Base_ptr p_Var8;
  char *__assertion;
  long lVar9;
  long lVar10;
  iterator typeIt_local;
  iterator *local_38;
  
  typeIt_local = typeIt;
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>_>_>
          ::find(&(this->m_structs)._M_t,typeIt._M_node + 1);
  if ((_Rb_tree_header *)iVar5._M_node == &(this->m_structs)._M_t._M_impl.super__Rb_tree_header) {
    __assertion = "structIt != m_structs.end()";
    __line = 0x6a;
    goto LAB_001090a6;
  }
  p_Var1 = iVar5._M_node[2]._M_parent;
  for (p_Var8 = *(_Base_ptr *)(iVar5._M_node + 2); p_Var8 != p_Var1; p_Var8 = p_Var8 + 6) {
    typeIt_00 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                ::find(&(this->m_types)._M_t,(key_type *)(p_Var8 + 1));
    if (((_Rb_tree_header *)typeIt_00._M_node != &(this->m_types)._M_t._M_impl.super__Rb_tree_header
        ) && (typeIt_00._M_node[2]._M_color == 9)) {
      reqIt = addImplicitlyRequiredTypes(this,(iterator)typeIt_00._M_node,extensionData,reqIt);
    }
  }
  if (typeIt._M_node[3]._M_left != (_Base_ptr)0x0) {
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)(typeIt._M_node + 3) + 0x20),&extensionData->name);
    if ((!_Var3) &&
       (_Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(*(long *)(typeIt._M_node + 3) + 0x20),&extensionData->depends),
       !_Var3)) {
      __assertion = 
      "typeIt->second.requiredBy.empty() || ( *typeIt->second.requiredBy.begin() == extensionData.name ) || ( *typeIt->second.requiredBy.begin() == extensionData.depends )"
      ;
      __line = 0x74;
      goto LAB_001090a6;
    }
    if (typeIt._M_node[3]._M_left != (_Base_ptr)0x0) {
      return (iterator)reqIt._M_current;
    }
  }
  _Var6 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    ((extensionData->requireData).types.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,reqIt._M_current,typeIt._M_node + 1);
  if (_Var6._M_current != reqIt._M_current) {
    return (iterator)reqIt._M_current;
  }
  pbVar2 = (extensionData->requireData).types.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = &typeIt_local;
  lVar9 = (long)pbVar2 - (long)reqIt._M_current;
  iVar7._M_current = reqIt._M_current;
  for (lVar10 = lVar9 >> 7; _Var6._M_current = iVar7._M_current, 0 < lVar10; lVar10 = lVar10 + -1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::$_0>
            ::operator()((_Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::__0>
                          *)&local_38,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )iVar7._M_current);
    if (bVar4) goto LAB_00108fb5;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::$_0>
            ::operator()((_Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::__0>
                          *)&local_38,iVar7._M_current + 1);
    _Var6._M_current = iVar7._M_current + 1;
    if (bVar4) goto LAB_00108fb5;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::$_0>
            ::operator()((_Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::__0>
                          *)&local_38,iVar7._M_current + 2);
    _Var6._M_current = iVar7._M_current + 2;
    if (bVar4) goto LAB_00108fb5;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::$_0>
            ::operator()((_Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::__0>
                          *)&local_38,iVar7._M_current + 3);
    _Var6._M_current = iVar7._M_current + 3;
    if (bVar4) goto LAB_00108fb5;
    iVar7._M_current = iVar7._M_current + 4;
    lVar9 = lVar9 + -0x80;
  }
  lVar9 = lVar9 >> 5;
  if (lVar9 == 1) {
LAB_00109042:
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::$_0>
            ::operator()((_Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::__0>
                          *)&local_38,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )iVar7._M_current);
    _Var6._M_current = iVar7._M_current;
    if (!bVar4) {
      _Var6._M_current = pbVar2;
    }
  }
  else if (lVar9 == 2) {
LAB_00109023:
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::$_0>
            ::operator()((_Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::__0>
                          *)&local_38,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )iVar7._M_current);
    _Var6._M_current = iVar7._M_current;
    if (!bVar4) {
      iVar7._M_current = iVar7._M_current + 1;
      goto LAB_00109042;
    }
  }
  else {
    if (lVar9 != 3) goto LAB_00108fc3;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::$_0>
            ::operator()((_Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::__0>
                          *)&local_38,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )iVar7._M_current);
    if (!bVar4) {
      iVar7._M_current = iVar7._M_current + 1;
      goto LAB_00109023;
    }
  }
LAB_00108fb5:
  if (_Var6._M_current == pbVar2) {
LAB_00108fc3:
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&typeIt_local._M_node[2]._M_parent,&extensionData->name);
    iVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&(extensionData->requireData).types,reqIt._M_current,
                     (value_type *)(typeIt_local._M_node + 1));
    return (iterator)(iVar7._M_current + 1);
  }
  __assertion = 
  "std::none_of( reqIt, extensionData.requireData.types.end(), [&typeIt]( std::string const & type ) { return type == typeIt->first; } )"
  ;
  __line = 0x77;
LAB_001090a6:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                ,__line,
                "std::vector<std::string>::iterator VideoHppGenerator::addImplicitlyRequiredTypes(std::map<std::string, TypeData>::iterator, ExtensionData &, std::vector<std::string>::iterator)"
               );
}

Assistant:

std::vector<std::string>::iterator VideoHppGenerator::addImplicitlyRequiredTypes( std::map<std::string, TypeData>::iterator typeIt,
                                                                                  ExtensionData &                           extensionData,
                                                                                  std::vector<std::string>::iterator        reqIt )
{
  auto structIt = m_structs.find( typeIt->first );
  assert( structIt != m_structs.end() );
  for ( auto const & member : structIt->second.members )
  {
    auto memberTypeIt = m_types.find( member.type.type );
    if ( ( memberTypeIt != m_types.end() ) && ( memberTypeIt->second.category == TypeCategory::Struct ) )
    {
      reqIt = addImplicitlyRequiredTypes( memberTypeIt, extensionData, reqIt );
    }
  }
  assert( typeIt->second.requiredBy.empty() || ( *typeIt->second.requiredBy.begin() == extensionData.name ) ||
          ( *typeIt->second.requiredBy.begin() == extensionData.depends ) );
  if ( typeIt->second.requiredBy.empty() && ( std::find( extensionData.requireData.types.begin(), reqIt, typeIt->first ) == reqIt ) )
  {
    assert( std::none_of( reqIt, extensionData.requireData.types.end(), [&typeIt]( std::string const & type ) { return type == typeIt->first; } ) );
    typeIt->second.requiredBy.insert( extensionData.name );
    reqIt = std::next( extensionData.requireData.types.insert( reqIt, typeIt->first ) );
  }
  return reqIt;
}